

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O3

uint32_t mpr_calculate_minimal_d_z_y(nhdp_domain *domain,neighbor_graph *graph,addr_node *y)

{
  uint32_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  list_entity *plVar4;
  ulong uVar5;
  uint uVar6;
  list_entity **pplVar7;
  netaddr_str nbuf1;
  netaddr_str nbuf2;
  
  if (y->min_d_z_y != 0) {
    return y->min_d_z_y;
  }
  plVar4 = (graph->set_n1).list_head.next;
  if (plVar4->prev == (graph->set_n1).list_head.prev) {
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = 0xffffffff;
    pplVar7 = (list_entity **)0x0;
    do {
      uVar1 = (*graph->methods->calculate_d_x_y)(domain,graph,(n1_node *)&plVar4[-3].prev,y);
      if (uVar1 < uVar6) {
        pplVar7 = &plVar4[-3].prev;
        uVar6 = uVar1;
      }
      plVar4 = plVar4->next;
    } while (plVar4->prev != (graph->set_n1).list_head.prev);
    if (pplVar7 != (list_entity **)0x0) {
      uVar5 = (ulong)LOG_MPR;
      if (((&log_global_mask)[uVar5] & 1) != 0) {
        uVar2 = netaddr_to_prefixstring(&nbuf1,y,0);
        uVar3 = netaddr_to_prefixstring(&nbuf2,pplVar7,0);
        oonf_log(1,uVar5,"src/nhdp/mpr/neighbor-graph.c",0xcb,0,0,"minimal d_z_y(%s) = %s (cost %u)"
                 ,uVar2,uVar3,uVar6);
      }
      goto LAB_0013ba58;
    }
  }
  uVar5 = (ulong)LOG_MPR;
  if (((&log_global_mask)[uVar5] & 1) != 0) {
    uVar2 = netaddr_to_prefixstring(&nbuf1,y,0);
    oonf_log(1,uVar5,"src/nhdp/mpr/neighbor-graph.c",0xce,0,0,"minimal d_z_y(%s) = infinite",uVar2);
  }
LAB_0013ba58:
  y->min_d_z_y = uVar6;
  return uVar6;
}

Assistant:

uint32_t
mpr_calculate_minimal_d_z_y(const struct nhdp_domain *domain, struct neighbor_graph *graph, struct addr_node *y) {
  struct n1_node *z_node;
  uint32_t d_z_y, min_d_z_y;
#ifdef OONF_LOG_DEBUG_INFO
  struct n1_node *remember;
  struct netaddr_str nbuf1, nbuf2;
#endif
  if (y->min_d_z_y) {
    return y->min_d_z_y;
  }

  min_d_z_y = RFC7181_METRIC_INFINITE_PATH;
#ifdef OONF_LOG_DEBUG_INFO
  remember = NULL;
#endif
  avl_for_each_element(&graph->set_n1, z_node, _avl_node) {
    d_z_y = graph->methods->calculate_d_x_y(domain, graph, z_node, y);
    if (d_z_y < min_d_z_y) {
      min_d_z_y = d_z_y;
#ifdef OONF_LOG_DEBUG_INFO
      remember = z_node;
#endif
    }
  }

#ifdef OONF_LOG_DEBUG_INFO
  if (remember) {
    OONF_DEBUG(LOG_MPR, "minimal d_z_y(%s) = %s (cost %u)", netaddr_to_string(&nbuf1, &y->addr),
      netaddr_to_string(&nbuf2, &remember->addr), min_d_z_y);
  }
  else {
    OONF_DEBUG(LOG_MPR, "minimal d_z_y(%s) = infinite", netaddr_to_string(&nbuf1, &y->addr));
  }
#endif
  y->min_d_z_y = min_d_z_y;
  return min_d_z_y;
}